

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftpd.c
# Opt level: O1

void timer(int signum)

{
  logmsg("alarm!");
  timeout = timeout + 5;
  if (0x18 < timeout) {
    if (wrotepidfile != 0) {
      wrotepidfile = 0;
      unlink(pidname);
    }
    if (serverlogslocked == '\x01') {
      serverlogslocked = '\0';
      clear_advisor_read_lock("log/serverlogs.lock");
    }
    exit(1);
  }
  siglongjmp((__jmp_buf_tag *)timeoutbuf,1);
}

Assistant:

static void timer(int signum)
{
  (void)signum;

  logmsg("alarm!");

  timeout += rexmtval;
  if(timeout >= maxtimeout) {
    if(wrotepidfile) {
      wrotepidfile = 0;
      unlink(pidname);
    }
    if(serverlogslocked) {
      serverlogslocked = 0;
      clear_advisor_read_lock(SERVERLOGS_LOCK);
    }
    exit(1);
  }
#ifdef HAVE_SIGSETJMP
  siglongjmp(timeoutbuf, 1);
#endif
}